

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgroupbox.cpp
# Opt level: O0

void __thiscall QGroupBox::QGroupBox(QGroupBox *this,QWidget *parent)

{
  long lVar1;
  QGroupBoxPrivate *this_00;
  QGroupBoxPrivate *this_01;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QGroupBoxPrivate *d;
  undefined8 in_stack_ffffffffffffffd8;
  QFlagsStorage<Qt::WindowType> f;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGroupBoxPrivate *)operator_new(0x288);
  QGroupBoxPrivate::QGroupBoxPrivate(this_00);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x5a3a9d);
  QWidget::QWidget(in_RDI,in_RSI,(QWidget *)this_00,(WindowFlags)f.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d140b0;
  *(undefined ***)&in_RDI->super_QPaintDevice = &PTR__QGroupBox_00d14268;
  this_01 = d_func((QGroupBox *)0x5a3ada);
  QGroupBoxPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QGroupBox::QGroupBox(QWidget *parent)
    : QWidget(*new QGroupBoxPrivate, parent, { })
{
    Q_D(QGroupBox);
    d->init();
}